

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O2

unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> __thiscall
duckdb::Binder::BindSelectNode
          (Binder *this,SelectNode *statement,
          unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
          *from_table)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *select_list;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *result_type_00;
  AggregateHandling AVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  pointer puVar4;
  pointer puVar5;
  ClientContext *pCVar6;
  pointer puVar7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  pointer pBVar9;
  optional_idx oVar10;
  __uniq_ptr_impl<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>_> _Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  pointer puVar14;
  pointer pLVar15;
  pointer pbVar16;
  pointer pbVar17;
  _func_int **pp_Var18;
  pointer prVar19;
  bool bVar20;
  int iVar21;
  idx_t iVar22;
  pointer pBVar23;
  reference pvVar24;
  pointer pBVar25;
  pointer pPVar26;
  mapped_type *pmVar27;
  reference pvVar28;
  mapped_type *pmVar29;
  type pBVar30;
  optional_ptr<duckdb::LogicalType,_true> oVar31;
  type pEVar32;
  mapped_type *pmVar33;
  pointer pBVar34;
  pointer pEVar35;
  BoundExpandedExpression *pBVar36;
  reference this_00;
  BinderException *pBVar37;
  reference pvVar38;
  __uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_> *in_RCX;
  BoundColumnReferenceInfo *bound_qualify_col;
  SelectNode *pSVar39;
  pointer pBVar40;
  pointer puVar41;
  ulong uVar42;
  pointer puVar43;
  Binder *pBVar44;
  ulong uVar45;
  initializer_list<std::reference_wrapper<duckdb::Binder>_> __l;
  allocator local_649;
  __uniq_ptr_impl<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>_> local_648;
  SelectNode *local_640;
  Binder *local_638;
  char local_629;
  undefined1 local_628 [16];
  vector<duckdb::BoundColumnReferenceInfo,_true> bound_columns;
  LogicalType result_type;
  optional_ptr<duckdb::ExpressionBinder,_true> local_5e0;
  vector<unsigned_long,_true> group_by_all_indexes;
  vector<duckdb::LogicalType,_true> internal_sql_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  new_names;
  vector<duckdb::BoundColumnReferenceInfo,_true> bound_qualify_columns;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  unbound_groups;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  group_by_all_indexes_set;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_4c0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  new_select_list;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_438;
  pointer puStack_430;
  pointer local_428;
  _Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  local_418;
  SelectBinder select_binder;
  OrderBinder order_binder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  BoundGroupInformation info;
  AggregateFunction local_160;
  
  local_640 = (SelectNode *)from_table;
  make_uniq<duckdb::BoundSelectNode>();
  local_638 = (Binder *)statement;
  iVar22 = GenerateTableIndex((Binder *)statement);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->projection_index = iVar22;
  iVar22 = GenerateTableIndex(local_638);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->group_index = iVar22;
  iVar22 = GenerateTableIndex(local_638);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->aggregate_index = iVar22;
  iVar22 = GenerateTableIndex(local_638);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->groupings_index = iVar22;
  iVar22 = GenerateTableIndex(local_638);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->window_index = iVar22;
  iVar22 = GenerateTableIndex(local_638);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->prune_index = iVar22;
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  ::std::__uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>::
  operator=((__uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_> *)
            &pBVar23->from_table,in_RCX);
  pSVar39 = local_640;
  if ((local_640->sample).
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl != (SampleOptions *)0x0) {
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    pSVar39 = local_640;
    ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::
    operator=((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *
              )&pBVar23->sample_options,
              (__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *
              )&local_640->sample);
  }
  new_select_list.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_select_list.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_select_list.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  select_list = &pSVar39->select_list;
  ExpandStarExpressions(local_638,select_list,&new_select_list);
  if (new_select_list.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      new_select_list.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&select_binder,"SELECT list is empty after resolving * expressions!",
               (allocator *)&group_by_all_indexes_set);
    BinderException::BinderException(pBVar37,(string *)&select_binder);
    __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::_M_move_assign(&select_list->
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ,&new_select_list);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  local_628._8_8_ = &pBVar23->bind_state;
  for (uVar45 = 0;
      uVar42 = (long)(local_640->select_list).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_640->select_list).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3, uVar45 < uVar42;
      uVar45 = uVar45 + 1) {
    pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(select_list,uVar45);
    pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar24);
    (*(pPVar26->super_BaseExpression)._vptr_BaseExpression[7])(&select_binder,pPVar26);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(pBVar25->super_BoundQueryNode).names,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&select_binder);
    ::std::__cxx11::string::~string((string *)&select_binder);
    ExpressionBinder::QualifyColumnNames(local_638,pvVar24);
    pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar24);
    if ((pPVar26->super_BaseExpression).alias._M_string_length != 0) {
      pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(pvVar24);
      pmVar27 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_628._8_8_,&(pPVar26->super_BaseExpression).alias);
      *pmVar27 = uVar45;
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator->(pvVar24);
      pBVar25 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_648);
      pvVar28 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>(&(pBVar25->super_BoundQueryNode).names,uVar45);
      ::std::__cxx11::string::_M_assign((string *)pvVar28);
    }
    select_binder.super_BaseSelectBinder.super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)
         unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(pvVar24);
    pmVar29 = ::std::__detail::
              _Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&(pBVar23->bind_state).projection_map,(key_type *)&select_binder);
    *pmVar29 = uVar45;
    pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar24);
    (*(pPVar26->super_BaseExpression)._vptr_BaseExpression[0xc])(&select_binder,pPVar26);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&(pBVar23->bind_state).original_expressions,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&select_binder);
    if (select_binder.super_BaseSelectBinder.super_ExpressionBinder._vptr_ExpressionBinder !=
        (_func_int **)0x0) {
      (**(code **)(*select_binder.super_BaseSelectBinder.super_ExpressionBinder.
                    _vptr_ExpressionBinder + 8))();
    }
  }
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->column_count = uVar42;
  if ((local_640->where_clause).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    puVar1 = &local_640->where_clause;
    BindWhereStarExpression(local_638,puVar1);
    ColumnAliasBinder::ColumnAliasBinder
              ((ColumnAliasBinder *)&group_by_all_indexes_set,(SelectBindState *)local_628._8_8_);
    WhereBinder::WhereBinder
              ((WhereBinder *)&select_binder,local_638,local_638->context,
               (ColumnAliasBinder *)&group_by_all_indexes_set);
    info.map._M_h._M_buckets =
         (__buckets_ptr)
         (puVar1->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (puVar1->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    ExpressionBinder::Bind
              ((ExpressionBinder *)&order_binder,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&select_binder,(LogicalType *)&info,false);
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    prVar19 = order_binder.binders.
              super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    order_binder.binders.
    super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var3._M_head_impl =
         (pBVar23->where_clause).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar23->where_clause).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)prVar19;
    if ((_Var3._M_head_impl != (Expression *)0x0) &&
       ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
       order_binder.binders.
       super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)((order_binder.binders.
                  super_vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                  .
                  super__Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_data->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    if (info.map._M_h._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)(*info.map._M_h._M_buckets)[1]._M_nxt)();
    }
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&select_binder);
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header);
  }
  pBVar44 = local_638;
  select_binder.super_BaseSelectBinder.super_ExpressionBinder._vptr_ExpressionBinder =
       (_func_int **)local_638;
  __l._M_len = 1;
  __l._M_array = (iterator)&select_binder;
  ::std::
  vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ::vector((vector<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
            *)&local_418,__l,(allocator_type *)&group_by_all_indexes_set);
  OrderBinder::OrderBinder
            (&order_binder,(vector<std::reference_wrapper<duckdb::Binder>,_true> *)&local_418,
             local_640,(SelectBindState *)local_628._8_8_);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::Binder>,_std::allocator<std::reference_wrapper<duckdb::Binder>_>_>
  ::~_Vector_base(&local_418);
  pBVar30 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                         *)&local_648);
  pSVar39 = local_640;
  PrepareModifiers(pBVar44,&order_binder,&local_640->super_QueryNode,&pBVar30->super_BoundQueryNode)
  ;
  unbound_groups.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unbound_groups.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unbound_groups.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info.map._M_h._M_buckets = &info.map._M_h._M_single_bucket;
  info.map._M_h._M_bucket_count = 1;
  info.map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  info.map._M_h._M_element_count = 0;
  info.map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  info.map._M_h._M_rehash_policy._M_next_resize = 0;
  info.map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  info.alias_map._M_h._M_buckets = &info.alias_map._M_h._M_single_bucket;
  info.alias_map._M_h._M_bucket_count = 1;
  info.alias_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  info.alias_map._M_h._M_element_count = 0;
  info.alias_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  info.alias_map._M_h._M_rehash_policy._M_next_resize = 0;
  info.alias_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  info.collated_groups._M_h._M_buckets = &info.collated_groups._M_h._M_single_bucket;
  info.collated_groups._M_h._M_bucket_count = 1;
  info.collated_groups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  info.collated_groups._M_h._M_element_count = 0;
  info.collated_groups._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  info.collated_groups._M_h._M_rehash_policy._M_next_resize = 0;
  info.collated_groups._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar4 = (pSVar39->groups).group_expressions.
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (pSVar39->groups).group_expressions.
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar5) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::resize(&unbound_groups.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ,(long)puVar5 - (long)puVar4 >> 3);
    pBVar44 = local_638;
    pCVar6 = local_638->context;
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    pSVar39 = local_640;
    GroupBinder::GroupBinder
              ((GroupBinder *)&group_by_all_indexes_set,pBVar44,pCVar6,local_640,
               pBVar23->group_index,(SelectBindState *)local_628._8_8_,&info.alias_map);
    for (internal_sql_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
         super__Vector_impl_data._M_start = (pointer)0x0;
        internal_sql_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start <
        (pointer)((long)(local_640->groups).group_expressions.
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_640->groups).group_expressions.
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        internal_sql_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&(internal_sql_types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start)->physical_type_) {
      pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(&(pSVar39->groups).group_expressions,
                            (size_type)
                            internal_sql_types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(pvVar24);
      (*(pPVar26->super_BaseExpression)._vptr_BaseExpression[0xc])
                ((AggregateFunction *)&select_binder,pPVar26);
      pp_Var18 = select_binder.super_BaseSelectBinder.super_ExpressionBinder._vptr_ExpressionBinder;
      select_binder.super_BaseSelectBinder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)0x0;
      if (((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )local_4c0._M_head_impl !=
           (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )0x0) &&
         ((**(code **)(*(long *)local_4c0._M_head_impl + 8))(),
         select_binder.super_BaseSelectBinder.super_ExpressionBinder._vptr_ExpressionBinder !=
         (_func_int **)0x0)) {
        (**(code **)(*select_binder.super_BaseSelectBinder.super_ExpressionBinder.
                      _vptr_ExpressionBinder + 8))();
      }
      LogicalType::LogicalType((LogicalType *)&bound_qualify_columns);
      oVar31.ptr = (LogicalType *)
                   vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   ::get<true>(&(pSVar39->groups).group_expressions,
                               (size_type)
                               internal_sql_types.
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      ExpressionBinder::Bind
                ((ExpressionBinder *)&bound_columns,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&group_by_all_indexes_set,oVar31,SUB81((LogicalType *)&bound_qualify_columns,0))
      ;
      pEVar32 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&bound_columns);
      iVar21 = (*(pEVar32->super_BaseExpression)._vptr_BaseExpression[4])(pEVar32);
      bVar20 = ExpressionBinder::PushCollation
                         (local_638->context,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&bound_columns,(LogicalType *)&bound_qualify_columns,ALL_COLLATIONS);
      if ((char)iVar21 == '\0' && bVar20) {
        pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_648);
        puVar43 = (pBVar23->aggregates).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar7 = (pBVar23->aggregates).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pmVar33 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&info.collated_groups,(key_type *)&internal_sql_types);
        *pmVar33 = (long)puVar7 - (long)puVar43 >> 3;
        FirstFunctionGetter::GetFunction((AggregateFunction *)&select_binder,&pEVar32->return_type);
        group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (*(pEVar32->super_BaseExpression)._vptr_BaseExpression[0x11])(&result_type,pEVar32);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&group_by_all_indexes,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &result_type);
        if (result_type._0_8_ != 0) {
          (**(code **)(*(long *)result_type._0_8_ + 8))();
        }
        FunctionBinder::FunctionBinder((FunctionBinder *)&new_names,local_638);
        AggregateFunction::AggregateFunction(&local_160,(AggregateFunction *)&select_binder);
        local_438.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
             group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        puStack_430 = group_by_all_indexes.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        local_428 = group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                    .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_5e0.ptr = (ExpressionBinder *)0x0;
        FunctionBinder::BindAggregateFunction
                  ((FunctionBinder *)local_628,(AggregateFunction *)&new_names,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)&local_160,&local_438,(AggregateType)&local_5e0);
        if ((Binder *)local_5e0.ptr != (Binder *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                       &(local_5e0.ptr)->_vptr_ExpressionBinder)->__weak_this_).internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        local_5e0.ptr = (ExpressionBinder *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&local_438);
        AggregateFunction::~AggregateFunction(&local_160);
        pBVar34 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                                *)local_628);
        ::std::__cxx11::string::string((string *)&result_type,"__collated_group",&local_649);
        ::std::__cxx11::string::operator=
                  ((string *)&(pBVar34->super_Expression).super_BaseExpression.alias,
                   (string *)&result_type);
        ::std::__cxx11::string::~string((string *)&result_type);
        pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_648);
        uVar12 = local_628._0_8_;
        local_628._0_8_ = (Binder *)0x0;
        uVar13 = local_628._0_8_;
        local_628[0] = (undefined1)uVar12;
        local_628[1] = SUB81(uVar12,1);
        local_628._2_6_ = SUB86(uVar12,2);
        result_type.id_ = local_628[0];
        result_type.physical_type_ = local_628[1];
        result_type._2_6_ = local_628._2_6_;
        local_628._0_8_ = uVar13;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar23->aggregates,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &result_type);
        if (result_type._0_8_ != 0) {
          (**(code **)(*(long *)result_type._0_8_ + 8))();
        }
        if ((Binder *)local_628._0_8_ != (Binder *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_628._0_8_)->__weak_this_).
                      internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&group_by_all_indexes);
        AggregateFunction::~AggregateFunction((AggregateFunction *)&select_binder);
      }
      pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_648);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar23->groups,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &bound_columns);
      pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(&unbound_groups,
                            (size_type)
                            internal_sql_types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      local_4c0._M_head_impl = (ParsedExpression *)0x0;
      _Var8._M_head_impl =
           (pvVar24->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pvVar24->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)pp_Var18;
      if (_Var8._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var8._M_head_impl)->super_BaseExpression + 8))();
      }
      pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(&unbound_groups,
                            (size_type)
                            internal_sql_types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      ExpressionBinder::QualifyColumnNames(local_638,pvVar24);
      pLVar15 = internal_sql_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::get<true>(&unbound_groups,
                            (size_type)
                            internal_sql_types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      select_binder.super_BaseSelectBinder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)
           unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(pvVar24);
      pmVar29 = ::std::__detail::
                _Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ParsedExpression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::ParsedExpression>,_duckdb::ExpressionHashFunction<duckdb::ParsedExpression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&info,(key_type *)&select_binder);
      *pmVar29 = (mapped_type)pLVar15;
      if (bound_columns.
          super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          .
          super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((bound_columns.
                       super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                       .
                       super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + 8))();
      }
      LogicalType::~LogicalType((LogicalType *)&bound_qualify_columns);
    }
    GroupBinder::~GroupBinder((GroupBinder *)&group_by_all_indexes_set);
  }
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pSVar39 = local_640;
  ::std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::_M_move_assign(&(pBVar23->groups).grouping_sets.
                    super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ,&(local_640->groups).grouping_sets);
  pBVar44 = local_638;
  puVar1 = &pSVar39->having;
  if ((pSVar39->having).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pCVar6 = local_638->context;
    pBVar30 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                           *)&local_648);
    HavingBinder::HavingBinder
              ((HavingBinder *)&select_binder,pBVar44,pCVar6,pBVar30,&info,
               local_640->aggregate_handling);
    ExpressionBinder::QualifyColumnNames((ExpressionBinder *)&select_binder,puVar1);
    ExpressionBinder::Bind
              ((ExpressionBinder *)&group_by_all_indexes_set,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&select_binder,(optional_ptr<duckdb::LogicalType,_true>)puVar1,false);
    pBVar44 = local_638;
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    uVar12 = group_by_all_indexes_set._M_t._M_impl._0_8_;
    group_by_all_indexes_set._M_t._M_impl._0_8_ = 0;
    _Var3._M_head_impl =
         (pBVar23->having).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar23->having).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
    ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar12;
    if ((_Var3._M_head_impl != (Expression *)0x0) &&
       ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
       group_by_all_indexes_set._M_t._M_impl._0_8_ != 0)) {
      (**(code **)(*(long *)group_by_all_indexes_set._M_t._M_impl._0_8_ + 8))();
    }
    HavingBinder::~HavingBinder((HavingBinder *)&select_binder);
  }
  bound_qualify_columns.
  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>.
  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bound_qualify_columns.
  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>.
  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bound_qualify_columns.
  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>.
  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result_type_00 = &local_640->qualify;
  if ((local_640->qualify).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    if (local_640->aggregate_handling == FORCE_AGGREGATES) {
      pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&select_binder,"Combining QUALIFY with GROUP BY ALL is not supported yet"
                 ,(allocator *)&group_by_all_indexes_set);
      BinderException::BinderException(pBVar37,(string *)&select_binder);
      __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar6 = pBVar44->context;
    pBVar30 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                           *)&local_648);
    QualifyBinder::QualifyBinder((QualifyBinder *)&select_binder,pBVar44,pCVar6,pBVar30,&info);
    ExpressionBinder::QualifyColumnNames(pBVar44,result_type_00);
    ExpressionBinder::Bind
              ((ExpressionBinder *)&group_by_all_indexes_set,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&select_binder,(optional_ptr<duckdb::LogicalType,_true>)result_type_00,false);
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    uVar12 = group_by_all_indexes_set._M_t._M_impl._0_8_;
    group_by_all_indexes_set._M_t._M_impl._0_8_ = 0;
    _Var3._M_head_impl =
         (pBVar23->qualify).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar23->qualify).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar12;
    if ((_Var3._M_head_impl != (Expression *)0x0) &&
       ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
       group_by_all_indexes_set._M_t._M_impl._0_8_ != 0)) {
      (**(code **)(*(long *)group_by_all_indexes_set._M_t._M_impl._0_8_ + 8))();
    }
    if (select_binder.super_BaseSelectBinder.super_ExpressionBinder.bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        select_binder.super_BaseSelectBinder.super_ExpressionBinder.bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (select_binder.super_BaseSelectBinder.bound_aggregate == true) {
        pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&group_by_all_indexes_set,
                   "Cannot mix aggregates with non-aggregated columns!",(allocator *)&result_type);
        BinderException::BinderException(pBVar37,(string *)&group_by_all_indexes_set);
        __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::
      vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
      operator=(&bound_qualify_columns.
                 super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                ,&select_binder.super_BaseSelectBinder.super_ExpressionBinder.bound_columns.
                  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
               );
    }
    QualifyBinder::~QualifyBinder((QualifyBinder *)&select_binder);
  }
  pCVar6 = pBVar44->context;
  pBVar30 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                         *)&local_648);
  SelectBinder::SelectBinder(&select_binder,pBVar44,pCVar6,pBVar30,&info);
  group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  new_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  new_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_sql_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  internal_sql_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_sql_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (bound_columns.
       super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
       .
       super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
       ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      puVar14 = group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish,
      bound_columns.
      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      .
      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start <
      (pointer)((long)(local_640->select_list).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_640->select_list).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
      bound_columns.
      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      .
      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&((bound_columns.
                              super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                              .
                              super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + 1
                    )) {
    pvVar24 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(select_list,
                          (size_type)
                          bound_columns.
                          super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                          .
                          super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar24);
    iVar21 = (*(pPVar26->super_BaseExpression)._vptr_BaseExpression[3])(pPVar26);
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    uVar45 = (pBVar23->unnests)._M_h._M_element_count;
    LogicalType::LogicalType(&result_type);
    oVar31.ptr = (LogicalType *)
                 vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::get<true>(select_list,
                             (size_type)
                             bound_columns.
                             super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                             .
                             super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    ExpressionBinder::Bind
              ((ExpressionBinder *)local_628,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&select_binder,oVar31,false);
    pBVar40 = bound_columns.
              super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
              .
              super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_629 = (char)iVar21;
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    pBVar9 = (pointer)pBVar23->column_count;
    AVar2 = local_640->aggregate_handling;
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    pBVar23->bound_column_count = pBVar23->bound_column_count + 1;
    pEVar35 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_628);
    if ((pEVar35->super_BaseExpression).type == BOUND_EXPANDED) {
      if (pBVar9 <= pBVar40) {
        pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&group_by_all_indexes_set,
                   "UNNEST of struct cannot be used in ORDER BY/DISTINCT ON clause",&local_649);
        BinderException::BinderException(pBVar37,(string *)&group_by_all_indexes_set);
        __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_640->aggregate_handling == FORCE_AGGREGATES) {
        pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&group_by_all_indexes_set,
                   "UNNEST of struct cannot be combined with GROUP BY ALL",&local_649);
        BinderException::BinderException(pBVar37,(string *)&group_by_all_indexes_set);
        __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pEVar35 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_628);
      pBVar36 = BaseExpression::Cast<duckdb::BoundExpandedExpression>
                          (&pEVar35->super_BaseExpression);
      puVar7 = (pBVar36->expanded_expressions).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar43 = (pBVar36->expanded_expressions).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar43 != puVar7;
          puVar43 = puVar43 + 1) {
        pEVar35 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar43);
        (*(pEVar35->super_BaseExpression)._vptr_BaseExpression[7])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &group_by_all_indexes_set,pEVar35);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&new_names,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &group_by_all_indexes_set);
        ::std::__cxx11::string::~string((string *)&group_by_all_indexes_set);
        pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_648);
        pEVar35 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar43);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&(pBVar23->super_BoundQueryNode).types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &pEVar35->return_type);
        pEVar35 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar43);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&internal_sql_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &pEVar35->return_type);
        pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_648);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar23->select_list,puVar43);
      }
      SelectBindState::AddExpandedColumn
                ((SelectBindState *)local_628._8_8_,
                 (long)(pBVar36->expanded_expressions).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pBVar36->expanded_expressions).
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    else {
      pEVar35 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_628);
      iVar21 = (*(pEVar35->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar35);
      if ((char)iVar21 != '\0') {
        SelectBindState::SetExpressionIsVolatile
                  ((SelectBindState *)local_628._8_8_,
                   (idx_t)bound_columns.
                          super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                          .
                          super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      }
      pEVar35 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_628);
      iVar21 = (*(pEVar35->super_BaseExpression)._vptr_BaseExpression[4])(pEVar35);
      if ((char)iVar21 != '\0') {
        SelectBindState::SetExpressionHasSubquery
                  ((SelectBindState *)local_628._8_8_,
                   (idx_t)bound_columns.
                          super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                          .
                          super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      }
      SelectBindState::AddRegularColumn((SelectBindState *)local_628._8_8_);
      bVar20 = AVar2 == FORCE_AGGREGATES && pBVar40 < pBVar9;
      if ((bVar20) &&
         (select_binder.super_BaseSelectBinder.super_ExpressionBinder.bound_columns.
          super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          .
          super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          select_binder.super_BaseSelectBinder.super_ExpressionBinder.bound_columns.
          super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          .
          super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        if (select_binder.super_BaseSelectBinder.bound_aggregate == true) {
          pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&group_by_all_indexes_set,
                     "Cannot mix aggregates with non-aggregated columns!",&local_649);
          BinderException::BinderException(pBVar37,(string *)&group_by_all_indexes_set);
          __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_629 != '\0') {
          pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&group_by_all_indexes_set,"Cannot group on a window clause",
                     &local_649);
          BinderException::BinderException(pBVar37,(string *)&group_by_all_indexes_set);
          __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_648);
        if (uVar45 < (pBVar23->unnests)._M_h._M_element_count) {
          pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&group_by_all_indexes_set,
                     "Cannot group on an UNNEST or UNLIST clause",&local_649);
          BinderException::BinderException(pBVar37,(string *)&group_by_all_indexes_set);
          __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&group_by_all_indexes,
                   (value_type_conflict2 *)&bound_columns);
      }
      pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_648);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar23->select_list,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_628);
      if (pBVar40 < pBVar9) {
        pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_648);
        pvVar28 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&(pBVar23->super_BoundQueryNode).names,
                              (size_type)
                              bound_columns.
                              super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                              .
                              super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&new_names,
                   pvVar28);
        pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_648);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&(pBVar23->super_BoundQueryNode).types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &result_type);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&internal_sql_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &result_type);
      if (bVar20) {
        BaseSelectBinder::ResetBindings(&select_binder.super_BaseSelectBinder);
      }
    }
    if ((Binder *)local_628._0_8_ != (Binder *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_628._0_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    LogicalType::~LogicalType(&result_type);
  }
  for (puVar41 = group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar41 != puVar14; puVar41 = puVar41 + 1) {
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(&pBVar23->select_list,*puVar41);
    pEVar35 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_00);
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    iVar22 = pBVar23->group_index;
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         (long)(pBVar23->groups).group_expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pBVar23->groups).group_expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    group_by_all_indexes_set._M_t._M_impl._0_8_ = iVar22;
    make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType&,duckdb::ColumnBinding>
              ((duckdb *)&result_type,&pEVar35->return_type,
               (ColumnBinding *)&group_by_all_indexes_set);
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar23->groups,this_00);
    uVar12 = result_type._0_8_;
    result_type.id_ = INVALID;
    result_type.physical_type_ = ~INVALID;
    result_type._2_6_ = 0;
    _Var3._M_head_impl =
         (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar12;
    if (_Var3._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
    }
    if (result_type._0_8_ != 0) {
      (**(code **)(*(long *)result_type._0_8_ + 8))();
    }
  }
  group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_header;
  group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
       0xffffffff00000000;
  group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       group_by_all_indexes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      group_by_all_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    puVar43 = (pBVar23->groups).group_expressions.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar7 = (pBVar23->groups).group_expressions.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (result_type._0_8_ = 0;
        (ulong)result_type._0_8_ < (ulong)((long)puVar43 - (long)puVar7 >> 3);
        result_type._0_8_ = result_type._0_8_ + 1) {
      ::std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&group_by_all_indexes_set,(unsigned_long *)&result_type);
    }
    pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                            *)&local_648);
    ::std::
    vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::push_back(&(pBVar23->groups).grouping_sets.
                 super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ,&group_by_all_indexes_set);
  }
  pbVar17 = new_names.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar16 = new_names.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->column_count = (long)pbVar17 - (long)pbVar16 >> 5;
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&(pBVar23->super_BoundQueryNode).names,&new_names);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  puVar43 = (pBVar23->select_list).
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar7 = (pBVar23->select_list).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  uVar45 = pBVar23->column_count;
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  pBVar23->need_prune = uVar45 < (ulong)((long)puVar43 - (long)puVar7 >> 3);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  if (((((pBVar23->groups).group_expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pBVar23->groups).group_expressions.
         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                  ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                                *)&local_648),
       (pBVar23->aggregates).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (pBVar23->aggregates).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) ||
      ((ParsedExpression *)
       (puVar1->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> != (ParsedExpression *)0x0)) ||
     (pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_648),
     (pBVar23->groups).grouping_sets.
     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
     .
     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     (pBVar23->groups).grouping_sets.
     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
     .
     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    if (local_640->aggregate_handling == NO_AGGREGATES_ALLOWED) {
      pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&result_type,"Aggregates cannot be present in a Project relation!",
                 (allocator *)&bound_columns);
      BinderException::BinderException(pBVar37,(string *)&result_type);
      __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bound_columns.
    super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
    .
    super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bound_columns.
    super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
    .
    super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bound_columns.
    super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
    .
    super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (select_binder.super_BaseSelectBinder.super_ExpressionBinder.bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        select_binder.super_BaseSelectBinder.super_ExpressionBinder.bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::
      vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
      operator=(&bound_columns.
                 super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                ,&select_binder.super_BaseSelectBinder.super_ExpressionBinder.bound_columns.
                  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
               );
    }
    pBVar9 = bound_qualify_columns.
             super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
             .
             super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar40 = bound_qualify_columns.
                   super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                   .
                   super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start; pBVar40 != pBVar9;
        pBVar40 = pBVar40 + 1) {
      ::std::
      vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
      push_back(&bound_columns.
                 super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                ,pBVar40);
    }
    if (bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      result_type._0_8_ =
           &result_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      result_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      result_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_
           = 0;
      ::std::__cxx11::string::assign((char *)&result_type);
      if (local_640->aggregate_handling != FORCE_AGGREGATES) {
        ::std::__cxx11::string::append((char *)&result_type);
        pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
        pvVar38 = vector<duckdb::BoundColumnReferenceInfo,_true>::get<true>(&bound_columns,0);
        oVar10.index = (pvVar38->query_location).index;
        pvVar38 = vector<duckdb::BoundColumnReferenceInfo,_true>::get<true>(&bound_columns,0);
        ::std::__cxx11::string::string((string *)&local_248,(string *)pvVar38);
        pvVar38 = vector<duckdb::BoundColumnReferenceInfo,_true>::get<true>(&bound_columns,0);
        ::std::__cxx11::string::string((string *)&local_268,(string *)pvVar38);
        pvVar38 = vector<duckdb::BoundColumnReferenceInfo,_true>::get<true>(&bound_columns,0);
        ::std::__cxx11::string::string((string *)&local_288,(string *)pvVar38);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (pBVar37,oVar10,(string *)&result_type,&local_248,&local_268,&local_288);
        __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::append((char *)&result_type);
      pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
      pvVar38 = vector<duckdb::BoundColumnReferenceInfo,_true>::get<true>(&bound_columns,0);
      oVar10.index = (pvVar38->query_location).index;
      pvVar38 = vector<duckdb::BoundColumnReferenceInfo,_true>::get<true>(&bound_columns,0);
      ::std::__cxx11::string::string((string *)&local_228,(string *)pvVar38);
      BinderException::BinderException<std::__cxx11::string>
                (pBVar37,oVar10,(string *)&result_type,&local_228);
      __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>::
    ~vector(&bound_columns.
             super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           );
  }
  if (((ParsedExpression *)
       (result_type_00->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> != (ParsedExpression *)0x0) &&
     (pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                              *)&local_648),
     (pBVar23->windows).
     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     .
     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start ==
     (pBVar23->windows).
     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     .
     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    pBVar37 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&result_type,
               "at least one window function must appear in the SELECT column or QUALIFY clause",
               (allocator *)&bound_columns);
    BinderException::BinderException(pBVar37,(string *)&result_type);
    __cxa_throw(pBVar37,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar30 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator*((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                         *)&local_648);
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  iVar22 = pBVar23->projection_index;
  pBVar23 = unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
            ::operator->((unique_ptr<duckdb::BoundSelectNode,_std::default_delete<duckdb::BoundSelectNode>,_true>
                          *)&local_648);
  BindModifiers(local_638,&pBVar30->super_BoundQueryNode,iVar22,
                &(pBVar23->super_BoundQueryNode).names,&internal_sql_types,
                (SelectBindState *)local_628._8_8_);
  _Var11._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>.
  super__Head_base<0UL,_duckdb::BoundSelectNode_*,_false>._M_head_impl =
       local_648._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>
       .super__Head_base<0UL,_duckdb::BoundSelectNode_*,_false>._M_head_impl;
  local_648._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>.
  super__Head_base<0UL,_duckdb::BoundSelectNode_*,_false>._M_head_impl =
       (tuple<duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>)
       (_Tuple_impl<0UL,_duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>)
       0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       _Var11._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>
       .super__Head_base<0UL,_duckdb::BoundSelectNode_*,_false>._M_head_impl;
  ::std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&group_by_all_indexes_set._M_t);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&internal_sql_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&new_names);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&group_by_all_indexes);
  ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&select_binder);
  ::std::vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ::~vector(&bound_qualify_columns.
             super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           );
  BoundGroupInformation::~BoundGroupInformation(&info);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&unbound_groups.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           );
  OrderBinder::~OrderBinder(&order_binder);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&new_select_list.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           );
  if (local_648._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>
      .super__Head_base<0UL,_duckdb::BoundSelectNode_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>)
      0x0) {
    (**(code **)(*(long *)local_648._M_t.
                          super__Tuple_impl<0UL,_duckdb::BoundSelectNode_*,_std::default_delete<duckdb::BoundSelectNode>_>
                          .super__Head_base<0UL,_duckdb::BoundSelectNode_*,_false>._M_head_impl + 8)
    )();
  }
  return (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
         (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)this;
}

Assistant:

unique_ptr<BoundQueryNode> Binder::BindSelectNode(SelectNode &statement, unique_ptr<BoundTableRef> from_table) {
	D_ASSERT(from_table);
	D_ASSERT(!statement.from_table);
	auto result = make_uniq<BoundSelectNode>();
	result->projection_index = GenerateTableIndex();
	result->group_index = GenerateTableIndex();
	result->aggregate_index = GenerateTableIndex();
	result->groupings_index = GenerateTableIndex();
	result->window_index = GenerateTableIndex();
	result->prune_index = GenerateTableIndex();

	result->from_table = std::move(from_table);
	// bind the sample clause
	if (statement.sample) {
		result->sample_options = std::move(statement.sample);
	}

	// visit the select list and expand any "*" statements
	vector<unique_ptr<ParsedExpression>> new_select_list;
	ExpandStarExpressions(statement.select_list, new_select_list);

	if (new_select_list.empty()) {
		throw BinderException("SELECT list is empty after resolving * expressions!");
	}
	statement.select_list = std::move(new_select_list);

	auto &bind_state = result->bind_state;
	for (idx_t i = 0; i < statement.select_list.size(); i++) {
		auto &expr = statement.select_list[i];
		result->names.push_back(expr->GetName());
		ExpressionBinder::QualifyColumnNames(*this, expr);
		if (!expr->GetAlias().empty()) {
			bind_state.alias_map[expr->GetAlias()] = i;
			result->names[i] = expr->GetAlias();
		}
		bind_state.projection_map[*expr] = i;
		bind_state.original_expressions.push_back(expr->Copy());
	}
	result->column_count = statement.select_list.size();

	// first visit the WHERE clause
	// the WHERE clause happens before the GROUP BY, PROJECTION or HAVING clauses
	if (statement.where_clause) {
		// bind any star expressions in the WHERE clause
		BindWhereStarExpression(statement.where_clause);

		ColumnAliasBinder alias_binder(bind_state);
		WhereBinder where_binder(*this, context, &alias_binder);
		unique_ptr<ParsedExpression> condition = std::move(statement.where_clause);
		result->where_clause = where_binder.Bind(condition);
	}

	// now bind all the result modifiers; including DISTINCT and ORDER BY targets
	OrderBinder order_binder({*this}, statement, bind_state);
	PrepareModifiers(order_binder, statement, *result);

	vector<unique_ptr<ParsedExpression>> unbound_groups;
	BoundGroupInformation info;
	auto &group_expressions = statement.groups.group_expressions;
	if (!group_expressions.empty()) {
		// the statement has a GROUP BY clause, bind it
		unbound_groups.resize(group_expressions.size());
		GroupBinder group_binder(*this, context, statement, result->group_index, bind_state, info.alias_map);
		for (idx_t i = 0; i < group_expressions.size(); i++) {

			// we keep a copy of the unbound expression;
			// we keep the unbound copy around to check for group references in the SELECT and HAVING clause
			// the reason we want the unbound copy is because we want to figure out whether an expression
			// is a group reference BEFORE binding in the SELECT/HAVING binder
			group_binder.unbound_expression = group_expressions[i]->Copy();
			group_binder.bind_index = i;

			// bind the groups
			LogicalType group_type;
			auto bound_expr = group_binder.Bind(group_expressions[i], &group_type);
			D_ASSERT(bound_expr->return_type.id() != LogicalTypeId::INVALID);

			// find out whether the expression contains a subquery, it can't be copied if so
			auto &bound_expr_ref = *bound_expr;
			bool contains_subquery = bound_expr_ref.HasSubquery();

			// push a potential collation, if necessary
			bool requires_collation = ExpressionBinder::PushCollation(context, bound_expr, group_type);
			if (!contains_subquery && requires_collation) {
				// if there is a collation on a group x, we should group by the collated expr,
				// but also push a first(x) aggregate in case x is selected (uncollated)
				info.collated_groups[i] = result->aggregates.size();

				auto first_fun = FirstFunctionGetter::GetFunction(bound_expr_ref.return_type);
				vector<unique_ptr<Expression>> first_children;
				// FIXME: would be better to just refer to this expression, but for now we copy
				first_children.push_back(bound_expr_ref.Copy());

				FunctionBinder function_binder(*this);
				auto function = function_binder.BindAggregateFunction(first_fun, std::move(first_children));
				function->SetAlias("__collated_group");
				result->aggregates.push_back(std::move(function));
			}
			result->groups.group_expressions.push_back(std::move(bound_expr));

			// in the unbound expression we DO bind the table names of any ColumnRefs
			// we do this to make sure that "table.a" and "a" are treated the same
			// if we wouldn't do this then (SELECT test.a FROM test GROUP BY a) would not work because "test.a" <> "a"
			// hence we convert "a" -> "test.a" in the unbound expression
			unbound_groups[i] = std::move(group_binder.unbound_expression);
			ExpressionBinder::QualifyColumnNames(*this, unbound_groups[i]);
			info.map[*unbound_groups[i]] = i;
		}
	}
	result->groups.grouping_sets = std::move(statement.groups.grouping_sets);

	// bind the HAVING clause, if any
	if (statement.having) {
		HavingBinder having_binder(*this, context, *result, info, statement.aggregate_handling);
		ExpressionBinder::QualifyColumnNames(having_binder, statement.having);
		result->having = having_binder.Bind(statement.having);
	}

	// bind the QUALIFY clause, if any
	vector<BoundColumnReferenceInfo> bound_qualify_columns;
	if (statement.qualify) {
		if (statement.aggregate_handling == AggregateHandling::FORCE_AGGREGATES) {
			throw BinderException("Combining QUALIFY with GROUP BY ALL is not supported yet");
		}
		QualifyBinder qualify_binder(*this, context, *result, info);
		ExpressionBinder::QualifyColumnNames(*this, statement.qualify);
		result->qualify = qualify_binder.Bind(statement.qualify);
		if (qualify_binder.HasBoundColumns()) {
			if (qualify_binder.BoundAggregates()) {
				throw BinderException("Cannot mix aggregates with non-aggregated columns!");
			}
			bound_qualify_columns = qualify_binder.GetBoundColumns();
		}
	}

	// after that, we bind to the SELECT list
	SelectBinder select_binder(*this, context, *result, info);

	// if we expand select-list expressions, e.g., via UNNEST, then we need to possibly
	// adjust the column index of the already bound ORDER BY modifiers, and not only set their types
	vector<idx_t> group_by_all_indexes;
	vector<string> new_names;
	vector<LogicalType> internal_sql_types;

	for (idx_t i = 0; i < statement.select_list.size(); i++) {
		bool is_window = statement.select_list[i]->IsWindow();
		idx_t unnest_count = result->unnests.size();
		LogicalType result_type;
		auto expr = select_binder.Bind(statement.select_list[i], &result_type, true);
		bool is_original_column = i < result->column_count;
		bool can_group_by_all =
		    statement.aggregate_handling == AggregateHandling::FORCE_AGGREGATES && is_original_column;
		result->bound_column_count++;

		if (expr->GetExpressionType() == ExpressionType::BOUND_EXPANDED) {
			if (!is_original_column) {
				throw BinderException("UNNEST of struct cannot be used in ORDER BY/DISTINCT ON clause");
			}
			if (statement.aggregate_handling == AggregateHandling::FORCE_AGGREGATES) {
				throw BinderException("UNNEST of struct cannot be combined with GROUP BY ALL");
			}

			auto &expanded = expr->Cast<BoundExpandedExpression>();
			auto &struct_expressions = expanded.expanded_expressions;
			D_ASSERT(!struct_expressions.empty());

			for (auto &struct_expr : struct_expressions) {
				new_names.push_back(struct_expr->GetName());
				result->types.push_back(struct_expr->return_type);
				internal_sql_types.push_back(struct_expr->return_type);
				result->select_list.push_back(std::move(struct_expr));
			}
			bind_state.AddExpandedColumn(struct_expressions.size());
			continue;
		}

		if (expr->IsVolatile()) {
			bind_state.SetExpressionIsVolatile(i);
		}
		if (expr->HasSubquery()) {
			bind_state.SetExpressionHasSubquery(i);
		}
		bind_state.AddRegularColumn();

		if (can_group_by_all && select_binder.HasBoundColumns()) {
			if (select_binder.BoundAggregates()) {
				throw BinderException("Cannot mix aggregates with non-aggregated columns!");
			}
			if (is_window) {
				throw BinderException("Cannot group on a window clause");
			}
			if (result->unnests.size() > unnest_count) {
				throw BinderException("Cannot group on an UNNEST or UNLIST clause");
			}
			// we are forcing aggregates, and the node has columns bound
			// this entry becomes a group
			group_by_all_indexes.push_back(i);
		}

		result->select_list.push_back(std::move(expr));
		if (is_original_column) {
			new_names.push_back(std::move(result->names[i]));
			result->types.push_back(result_type);
		}
		internal_sql_types.push_back(result_type);

		if (can_group_by_all) {
			select_binder.ResetBindings();
		}
	}

	// push the GROUP BY ALL expressions into the group set

	for (auto &group_by_all_index : group_by_all_indexes) {
		auto &expr = result->select_list[group_by_all_index];
		auto group_ref = make_uniq<BoundColumnRefExpression>(
		    expr->return_type, ColumnBinding(result->group_index, result->groups.group_expressions.size()));
		result->groups.group_expressions.push_back(std::move(expr));
		expr = std::move(group_ref);
	}
	set<idx_t> group_by_all_indexes_set;
	if (!group_by_all_indexes.empty()) {
		idx_t num_set_indexes = result->groups.group_expressions.size();
		for (idx_t i = 0; i < num_set_indexes; i++) {
			group_by_all_indexes_set.insert(i);
		}
		D_ASSERT(result->groups.grouping_sets.empty());
		result->groups.grouping_sets.push_back(group_by_all_indexes_set);
	}
	result->column_count = new_names.size();
	result->names = std::move(new_names);
	result->need_prune = result->select_list.size() > result->column_count;

	// in the normal select binder, we bind columns as if there is no aggregation
	// i.e. in the query [SELECT i, SUM(i) FROM integers;] the "i" will be bound as a normal column
	// since we have an aggregation, we need to either (1) throw an error, or (2) wrap the column in a FIRST() aggregate
	// we choose the former one [CONTROVERSIAL: this is the PostgreSQL behavior]
	if (!result->groups.group_expressions.empty() || !result->aggregates.empty() || statement.having ||
	    !result->groups.grouping_sets.empty()) {
		if (statement.aggregate_handling == AggregateHandling::NO_AGGREGATES_ALLOWED) {
			throw BinderException("Aggregates cannot be present in a Project relation!");
		} else {
			vector<BoundColumnReferenceInfo> bound_columns;
			if (select_binder.HasBoundColumns()) {
				bound_columns = select_binder.GetBoundColumns();
			}
			for (auto &bound_qualify_col : bound_qualify_columns) {
				bound_columns.push_back(bound_qualify_col);
			}
			if (!bound_columns.empty()) {
				string error;
				error = "column \"%s\" must appear in the GROUP BY clause or must be part of an aggregate function.";
				if (statement.aggregate_handling == AggregateHandling::FORCE_AGGREGATES) {
					error += "\nGROUP BY ALL will only group entries in the SELECT list. Add it to the SELECT list or "
					         "GROUP BY this entry explicitly.";
					throw BinderException(bound_columns[0].query_location, error, bound_columns[0].name);
				} else {
					error +=
					    "\nEither add it to the GROUP BY list, or use \"ANY_VALUE(%s)\" if the exact value of \"%s\" "
					    "is not important.";
					throw BinderException(bound_columns[0].query_location, error, bound_columns[0].name,
					                      bound_columns[0].name, bound_columns[0].name);
				}
			}
		}
	}

	// QUALIFY clause requires at least one window function to be specified in at least one of the SELECT column list or
	// the filter predicate of the QUALIFY clause
	if (statement.qualify && result->windows.empty()) {
		throw BinderException("at least one window function must appear in the SELECT column or QUALIFY clause");
	}

	// now that the SELECT list is bound, we set the types of DISTINCT/ORDER BY expressions
	BindModifiers(*result, result->projection_index, result->names, internal_sql_types, bind_state);
	return std::move(result);
}